

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  u32 uVar1;
  u32 *in_RDX;
  int in_ESI;
  long in_RDI;
  BtShared *pBt;
  int *in_stack_00000020;
  int in_stack_0000002c;
  Btree *in_stack_00000030;
  Pager *pPager;
  int local_4;
  
  if (((*(char *)(in_RDI + 0x11) == '\0') && (*(char *)(in_RDI + 0x10) != '\0')) &&
     ((*(char *)(in_RDI + 0x10) != '\x01' || (in_ESI == 0)))) {
    pPager = *(Pager **)(in_RDI + 8);
    if (in_RDX != (u32 *)0x0) {
      uVar1 = sqlite3Get4byte((u8 *)(*(long *)(*(long *)&pPager->setSuper + 0x50) + 0x28));
      *in_RDX = uVar1;
    }
    if (in_ESI == 0) {
      local_4 = 0;
    }
    else {
      local_4 = sqlite3PagerOpenSavepoint(pPager,0);
    }
  }
  else {
    local_4 = btreeBeginTrans(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt;
  if( p->sharable
   || p->inTrans==TRANS_NONE
   || (p->inTrans==TRANS_READ && wrflag!=0)
  ){
    return btreeBeginTrans(p,wrflag,pSchemaVersion);
  }
  pBt = p->pBt;
  if( pSchemaVersion ){
    *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
  }
  if( wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    return sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }else{
    return SQLITE_OK;
  }
}